

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async.c
# Opt level: O3

void uv__async_io(uv_loop_t *loop,uv__io_t *w,uint events)

{
  ssize_t sVar1;
  int *piVar2;
  code *UNRECOVERED_JUMPTABLE;
  int iVar3;
  int iVar4;
  char buf [1024];
  int local_428 [258];
  
  iVar4 = 0;
  do {
    do {
      sVar1 = read(w->fd,local_428,0x400);
      iVar3 = 0;
      if (0 < sVar1) {
        iVar3 = (int)sVar1;
      }
      iVar4 = iVar4 + iVar3;
    } while (sVar1 == 0x400);
    if (sVar1 != -1) goto LAB_00109983;
    piVar2 = __errno_location();
  } while (*piVar2 == 4);
  if (*piVar2 != 0xb) {
    abort();
  }
LAB_00109983:
  piVar2 = &w[-1].fd;
  if (*(int *)&w[1].cb == -1) {
    if (iVar4 != 8) {
      __assert_fail("n == sizeof(val)","src/unix/async.c",0x9d,
                    "void uv__async_io(uv_loop_t *, uv__io_t *, unsigned int)");
    }
    UNRECOVERED_JUMPTABLE = *(code **)piVar2;
  }
  else {
    UNRECOVERED_JUMPTABLE = *(code **)piVar2;
    local_428[0] = iVar4;
  }
  (*UNRECOVERED_JUMPTABLE)(loop,piVar2,local_428[0]);
  return;
}

Assistant:

static void uv__async_io(uv_loop_t* loop, uv__io_t* w, unsigned int events) {
  struct uv__async* wa;
  char buf[1024];
  unsigned n;
  ssize_t r;

  n = 0;
  for (;;) {
    r = read(w->fd, buf, sizeof(buf));

    if (r > 0)
      n += r;

    if (r == sizeof(buf))
      continue;

    if (r != -1)
      break;

    if (errno == EAGAIN || errno == EWOULDBLOCK)
      break;

    if (errno == EINTR)
      continue;

    abort();
  }

  wa = container_of(w, struct uv__async, io_watcher);

#if defined(__linux__)
  if (wa->wfd == -1) {
    uint64_t val;
    assert(n == sizeof(val));
    memcpy(&val, buf, sizeof(val));  /* Avoid alignment issues. */
    wa->cb(loop, wa, val);
    return;
  }
#endif

  wa->cb(loop, wa, n);
}